

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

basic_value<toml::type_config> *
toml::parse<toml::type_config>
          (basic_value<toml::type_config> *__return_storage_ptr__,istream *is,string fname,spec s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer peVar2;
  string fname_00;
  spec s_00;
  value_type *v;
  error_type *peVar3;
  syntax_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  error_info *extraout_RDX;
  error_info *err;
  error_info *extraout_RDX_00;
  pointer this_00;
  undefined8 in_stack_fffffffffffffe60;
  string msg;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  vector<toml::error_info,_std::allocator<toml::error_info>_> local_138;
  string local_120;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  res;
  
  std::__cxx11::string::string(&local_158,in_RDX);
  fname_00.field_2._8_8_ = in_stack_fffffffffffffe60;
  fname_00._0_24_ = fname._0_24_;
  s_00.version.patch = (undefined4)msg._M_string_length;
  s_00.v1_1_0_allow_control_characters_in_comments = (bool)msg._M_string_length._4_1_;
  s_00.v1_1_0_allow_newlines_in_inline_tables = (bool)msg._M_string_length._5_1_;
  s_00.v1_1_0_allow_trailing_comma_in_inline_tables = (bool)msg._M_string_length._6_1_;
  s_00.v1_1_0_allow_non_english_in_bare_keys = (bool)msg._M_string_length._7_1_;
  s_00.version._0_8_ = msg._M_dataplus._M_p;
  s_00.v1_1_0_add_escape_sequence_e = (bool)msg.field_2._M_local_buf[0];
  s_00.v1_1_0_add_escape_sequence_x = (bool)msg.field_2._1_1_;
  s_00.v1_1_0_make_seconds_optional = (bool)msg.field_2._2_1_;
  s_00.ext_hex_float = (bool)msg.field_2._3_1_;
  s_00.ext_num_suffix = (bool)msg.field_2._4_1_;
  s_00.ext_null_value = (bool)msg.field_2._5_1_;
  s_00._22_2_ = msg.field_2._6_2_;
  try_parse<toml::type_config>(&res,is,fname_00,s_00);
  std::__cxx11::string::~string((string *)&local_158);
  if (res.is_ok_ == true) {
    v = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
        ::unwrap(&res,(source_location)0x4dacb0);
    basic_value<toml::type_config>::basic_value(__return_storage_ptr__,v);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::cleanup(&res,(EVP_PKEY_CTX *)v);
    return __return_storage_ptr__;
  }
  paVar1 = &msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  msg._M_dataplus._M_p = (pointer)paVar1;
  peVar3 = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
           ::unwrap_err(&res,(source_location)0x4dacc8);
  peVar2 = (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  err = extraout_RDX;
  for (this_00 = (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != peVar2; this_00 = this_00 + 1)
  {
    format_error_abi_cxx11_(&local_120,(toml *)this_00,err);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    err = extraout_RDX_00;
  }
  this = (syntax_error *)__cxa_allocate_exception(0x40);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p == paVar1) {
    local_178.field_2._8_8_ = msg.field_2._8_8_;
  }
  else {
    local_178._M_dataplus._M_p = msg._M_dataplus._M_p;
  }
  local_178.field_2._M_allocated_capacity._1_7_ = msg.field_2._M_allocated_capacity._1_7_;
  local_178.field_2._M_local_buf[0] = msg.field_2._M_local_buf[0];
  local_178._M_string_length = msg._M_string_length;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  msg._M_dataplus._M_p = (pointer)paVar1;
  peVar3 = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
           ::unwrap_err(&res,(source_location)0x4dace0);
  local_138.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
  super__Vector_impl_data._M_start =
       (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_138.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (peVar3->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  syntax_error::syntax_error(this,&local_178,&local_138);
  __cxa_throw(this,&syntax_error::typeinfo,syntax_error::~syntax_error);
}

Assistant:

basic_value<TC> parse(std::istream& is, std::string fname = "unknown file", spec s = spec::default_version())
{
    auto res = try_parse<TC>(is, std::move(fname), std::move(s));
    if(res.is_ok())
    {
        return res.unwrap();
    }
    else
    {
        std::string msg;
        for(const auto& err : res.unwrap_err())
        {
            msg += format_error(err);
        }
        throw syntax_error(std::move(msg), std::move(res.unwrap_err()));
    }
}